

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void deserialize_model<char_const*>(TreesIndexer *model,char **in)

{
  bool bVar1;
  iterator node;
  vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *in_RSI;
  SingleTreeIndex *tree;
  iterator __end1;
  iterator __begin1;
  vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *__range1;
  size_t vec_size;
  reference in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  __normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
  local_28 [2];
  size_type in_stack_ffffffffffffffe8;
  
  if (!interrupt_switch) {
    read_bytes<unsigned_long>
              (in_stack_ffffffffffffffd0,(size_t)in_stack_ffffffffffffffc8,(char **)0x67b2c3);
    std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::resize
              (in_RSI,in_stack_ffffffffffffffe8);
    std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::shrink_to_fit
              ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)0x67b2dc);
    local_28[0]._M_current =
         (SingleTreeIndex *)
         std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::begin
                   ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                    in_stack_ffffffffffffffc8);
    node = std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::end
                     ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                      in_stack_ffffffffffffffc8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
                               *)node._M_current,
                              (__normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
                               *)in_stack_ffffffffffffffc8), bVar1) {
      in_stack_ffffffffffffffc8 =
           __gnu_cxx::
           __normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
           ::operator*(local_28);
      deserialize_node<char_const*>(node._M_current,(char **)in_stack_ffffffffffffffc8);
      __gnu_cxx::
      __normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
      ::operator++(local_28);
    }
  }
  return;
}

Assistant:

void deserialize_model(TreesIndexer &model, itype &in)
{
    if (interrupt_switch) return;

    size_t vec_size;
    read_bytes<size_t>(&vec_size, (size_t)1, in);
    model.indices.resize(vec_size);
    model.indices.shrink_to_fit();
    for (auto &tree : model.indices)
        deserialize_node(tree, in);
}